

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-condvar.c
# Opt level: O0

int condvar_timedwait(worker_config_conflict *c,int *flag)

{
  int iVar1;
  int64_t eval_b_1;
  int64_t eval_a_1;
  int64_t eval_b;
  int64_t eval_a;
  int r;
  int *flag_local;
  worker_config_conflict *c_local;
  
  uv_mutex_lock(&c->mutex);
  uv_sem_post(&c->sem_waiting);
  do {
    iVar1 = uv_cond_timedwait(&c->cond,&c->mutex,1000000000);
    if ((long)iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-condvar.c"
              ,0xb3,"r","==","0",(long)iVar1,"==",0);
      abort();
    }
  } while (*flag == 0);
  if ((long)*flag != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-condvar.c"
            ,0xb5,"1","==","*flag",1,"==",(long)*flag);
    abort();
  }
  uv_mutex_unlock(&c->mutex);
  uv_sem_wait(&c->sem_signaled);
  return iVar1;
}

Assistant:

static int condvar_timedwait(worker_config* c, const int* flag) {
  int r;

  r = 0;

  uv_mutex_lock(&c->mutex);

  /* Tell signal'er that I am waiting. */
  uv_sem_post(&c->sem_waiting);

  /* Wait until I get a non-spurious signal. */
  do {
    r = uv_cond_timedwait(&c->cond, &c->mutex, (uint64_t)(1 * 1e9)); /* 1 s */
    ASSERT_OK(r); /* Should not time out. */
  } while (*flag == 0);
  ASSERT_EQ(1, *flag);

  uv_mutex_unlock(&c->mutex);

  /* Wait for my signal'er to finish. */
  uv_sem_wait(&c->sem_signaled);
  return r;
}